

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binds.cpp
# Opt level: O0

void CBinds::ConfigSaveCallback(IConfigManager *pConfigManager,void *pUserData)

{
  int Key_00;
  char *pcVar1;
  IInput *pIVar2;
  char *pcVar3;
  long in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  int Modifier;
  int Key;
  uint j;
  char *pDst;
  char *pEnd;
  char *pSrc;
  int m;
  int i;
  CBinds *pSelf;
  char aBind [256];
  char aBuffer [512];
  uint local_344;
  char *local_340;
  char *local_330;
  int local_328;
  int local_324;
  char local_308 [64];
  char cStack_209;
  char local_208 [512];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  for (local_324 = 0; local_324 < 0x1da; local_324 = local_324 + 1) {
    for (local_328 = 0; local_328 < 4; local_328 = local_328 + 1) {
      if (*(char *)(in_RSI + 0x28 + (long)local_324 * 0x200 + (long)local_328 * 0x80) != '\0') {
        local_340 = local_308;
        local_330 = (char *)(in_RSI + 0x28 + (long)local_324 * 0x200 + (long)local_328 * 0x80);
        while (*local_330 != '\0' && local_340 < &cStack_209) {
          if ((*local_330 == '\"') || (*local_330 == '\\')) {
            *local_340 = '\\';
            local_340 = local_340 + 1;
          }
          *local_340 = *local_330;
          local_340 = local_340 + 1;
          local_330 = local_330 + 1;
        }
        *local_340 = '\0';
        pcVar1 = GetModifierName(local_328);
        pIVar2 = CComponent::Input((CComponent *)0x14847c);
        pcVar3 = IInput::KeyName(pIVar2,local_324);
        str_format(local_208,0x200,"bind %s%s \"%s\"",pcVar1,pcVar3,local_308);
        (**(code **)(*in_RDI + 0x40))(in_RDI,local_208);
      }
    }
  }
  for (local_344 = 0; local_344 < 0x1d; local_344 = local_344 + 1) {
    Key_00 = s_aaDefaultBindKeys[local_344][0];
    if (*(char *)(in_RSI + 0x28 + (long)Key_00 * 0x200 +
                 (long)s_aaDefaultBindKeys[local_344][1] * 0x80) == '\0') {
      pcVar1 = GetModifierName(s_aaDefaultBindKeys[local_344][1]);
      pIVar2 = CComponent::Input((CComponent *)0x14856f);
      pcVar3 = IInput::KeyName(pIVar2,Key_00);
      str_format(local_208,0x200,"unbind %s%s",pcVar1,pcVar3);
      (**(code **)(*in_RDI + 0x40))(in_RDI,local_208);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CBinds::ConfigSaveCallback(IConfigManager *pConfigManager, void *pUserData)
{
	CBinds *pSelf = (CBinds *)pUserData;

	char aBuffer[512];
	for(int i = 0; i < KEY_LAST; i++)
	{
		for(int m = 0; m < MODIFIER_COUNT; m++)
		{
			if(pSelf->m_aaaKeyBindings[i][m][0] == 0)
				continue;

			// process the string. we need to escape some characters
			char aBind[2*BIND_LENGTH];
			const char *pSrc = pSelf->m_aaaKeyBindings[i][m];
			const char *pEnd = aBind + sizeof(aBind) - 1;
			char *pDst = aBind;
			while(*pSrc && pDst < pEnd)
			{
				if(*pSrc == '"' || *pSrc == '\\') // escape \ and "
					*pDst++ = '\\';
				*pDst++ = *pSrc++;
			}
			*pDst = 0;

			str_format(aBuffer, sizeof(aBuffer), "bind %s%s \"%s\"", GetModifierName(m), pSelf->Input()->KeyName(i), aBind);
			pConfigManager->WriteLine(aBuffer);
		}
	}

	for(unsigned j = 0; j < sizeof(s_aaDefaultBindKeys)/sizeof(int)/2; j++)
	{
		const int Key = s_aaDefaultBindKeys[j][0];
		const int Modifier = s_aaDefaultBindKeys[j][1];
		if(pSelf->m_aaaKeyBindings[Key][Modifier][0] == 0)
		{
			// explicitly unbind keys that were unbound by the user
			str_format(aBuffer, sizeof(aBuffer), "unbind %s%s", GetModifierName(Modifier), pSelf->Input()->KeyName(Key));
			pConfigManager->WriteLine(aBuffer);
		}
	}
}